

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_test.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_b3fcdf::X509Test_CommonNameAndNameConstraints_Test::TestBody
          (X509Test_CommonNameAndNameConstraints_Test *this)

{
  void *pvVar1;
  _Head_base<0UL,_x509_st_*,_false> _Var2;
  int iVar3;
  char *in_RCX;
  char *pcVar4;
  int *piVar5;
  pointer *__ptr;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  char *message;
  pointer message_00;
  char *in_R9;
  pointer *__ptr_1;
  initializer_list<x509_st_*> __l;
  initializer_list<x509_st_*> __l_00;
  initializer_list<x509_st_*> __l_01;
  initializer_list<x509_st_*> __l_02;
  initializer_list<x509_st_*> __l_03;
  initializer_list<x509_st_*> __l_04;
  anon_class_16_2_a4d0f9f0 verify_cert;
  UniquePtr<X509> intermediate;
  UniquePtr<X509> not_dns;
  UniquePtr<X509> not_permitted_with_sans;
  UniquePtr<X509> not_permitted;
  UniquePtr<X509> root;
  UniquePtr<X509> permitted;
  undefined1 local_148 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_140;
  pointer local_138;
  allocator_type local_12a;
  allocator_type local_129;
  undefined1 local_128 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_120;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_> local_108;
  anon_class_16_2_a4d0f9f0 local_e8;
  int local_d4;
  internal local_d0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c8;
  _Head_base<0UL,_x509_st_*,_false> local_c0;
  _Head_base<0UL,_x509_st_*,_false> local_b8;
  _Head_base<0UL,_x509_st_*,_false> local_b0;
  __uniq_ptr_impl<x509_st,_bssl::internal::Deleter> local_a8;
  _Head_base<0UL,_x509_st_*,_false> local_a0;
  int local_94;
  _Head_base<0UL,_x509_st_*,_false> local_90;
  _Head_base<0UL,_x509_st_*,_false> local_88;
  _Head_base<0UL,_x509_st_*,_false> local_80;
  _Any_data local_78;
  code *local_68;
  undefined8 uStack_60;
  _Any_data local_58;
  code *local_48;
  undefined8 uStack_40;
  _Any_data local_38;
  code *local_28;
  undefined8 uStack_20;
  
  pcVar4 = local_148;
  CertFromPEM((anon_unknown_dwarf_b3fcdf *)&local_a0,
              "\n-----BEGIN CERTIFICATE-----\nMIICTTCCAbagAwIBAgIIAj5CwoHlWuYwDQYJKoZIhvcNAQELBQAwKzEXMBUGA1UE\nChMOQm9yaW5nU1NMIFRlc3QxEDAOBgNVBAMTB1Jvb3QgQ0EwHhcNMTUwMTAxMDAw\nMDAwWhcNMjUwMTAxMDAwMDAwWjArMRcwFQYDVQQKEw5Cb3JpbmdTU0wgVGVzdDEQ\nMA4GA1UEAxMHUm9vdCBDQTCBnzANBgkqhkiG9w0BAQEFAAOBjQAwgYkCgYEA6Q5/\nEQzmWuaGg3D2UQcuAngR9bIkkjjuJmICx5TxPqF3asCP1SJotl3iTNrghRE1wpJy\nSY2BtIiXa7f8skRb2U0GcPkMxo/ps9+jaoRsQ1m+nbLQdpvD1/qZWcO45fNTA71J\n1rPMokP+rcILuQG4VimUAySnDSghKamulFtK+Z8CAwEAAaN6MHgwDgYDVR0PAQH/\nBAQDAgIEMB0GA1UdJQQWMBQGCCsGAQUFBwMBBggrBgEFBQcDAjAPBgNVHRMBAf8E\nBTADAQH/MBkGA1UdDgQSBBBAN9cB+0AvuBx+VAQnjFkBMBsGA1UdIwQUMBKAEEA3\n1wH7QC+4HH5UBCeMWQEwDQYJKoZIhvcNAQELBQADgYEAc4N6hTE62/3gwg+kyc2f\nc/Jj1mHrOt+0NRaBnmvbmNpsEjHS96Ef4Wt/ZlPXPkkv1C1VosJnOIMF3Q522wRH\nbqaxARldS12VAa3gcWisDWD+SqSyDxjyojz0XDiJkTrFuCTCUiZO+1GLB7SO10Ms\nd5YVX0c90VMnUhF/dlrqS9U=\n-----END CERTIFICATE-----\n"
             );
  local_148[0] = local_a0._M_head_impl != (x509_st *)0x0;
  local_140 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_a0._M_head_impl == (x509_st *)0x0) {
    testing::Message::Message((Message *)&local_108);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_128,(internal *)local_148,(AssertionResult *)0x5a65c3,"false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_e8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
               ,0xceb,(char *)CONCAT71(local_128._1_7_,local_128[0]));
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_e8,(Message *)&local_108);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_128._1_7_,local_128[0]) != &local_118) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_128._1_7_,local_128[0]),local_118._M_allocated_capacity + 1)
      ;
    }
    if (local_108.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      (*(code *)(*local_108.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>.
                  _M_impl.super__Vector_impl_data._M_start)->sig_alg)();
    }
    if (local_140 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_140,local_140);
    }
    goto LAB_003b8970;
  }
  CertFromPEM((anon_unknown_dwarf_b3fcdf *)&local_c0,
              "\n-----BEGIN CERTIFICATE-----\nMIICDjCCAXegAwIBAgIBAjANBgkqhkiG9w0BAQsFADArMRcwFQYDVQQKEw5Cb3Jp\nbmdTU0wgVGVzdDEQMA4GA1UEAxMHUm9vdCBDQTAgFw0wMDAxMDEwMDAwMDBaGA8y\nMDk5MDEwMTAwMDAwMFowKDEmMCQGA1UEAxMdTmFtZSBDb25zdHJhaW50cyBJbnRl\ncm1lZGlhdGUwWTATBgcqhkjOPQIBBggqhkjOPQMBBwNCAASbbbWYiN6mn+BCpg4X\nNpibOH0D/DN4kZ5C/Ml2YVomC9T83OKk2CzB8fPAabPb4P4Vv+fIabpEfjWS5nzK\nLY1yo4GJMIGGMA8GA1UdEwEB/wQFMAMBAf8wGwYDVR0jBBQwEoAQQDfXAftAL7gc\nflQEJ4xZATBWBgNVHR4BAf8ETDBKoCowEYIPcGVybWl0dGVkMS50ZXN0MBWCE2Zv\nby5wZXJtaXR0ZWQyLnRlc3ShHDAaghhleGNsdWRlZC5wZXJtaXR0ZWQxLnRlc3Qw\nDQYJKoZIhvcNAQELBQADgYEAFq1Ka05hiKREwRpSceQPzIIH4B5a5IVBg5/EvmQI\n9V0fXyAE1GmahPt70sIBxIgzNTEaY8P/IoOuCdlZWe0msmyEO3S6YSAzOWR5Van6\ncXmFM1uMd95TlkxUMRdV+jKJTvG6R/BM2zltaV7Xt662k5HtzT5Svw0rZlFaggZz\nUyM=\n-----END CERTIFICATE-----\n"
             );
  local_148[0] = local_c0._M_head_impl != (x509_st *)0x0;
  local_140 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_c0._M_head_impl == (x509_st *)0x0) {
    testing::Message::Message((Message *)&local_108);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_128,(internal *)local_148,(AssertionResult *)0x5841ab,"false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_e8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
               ,0xced,(char *)CONCAT71(local_128._1_7_,local_128[0]));
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_e8,(Message *)&local_108);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_128._1_7_,local_128[0]) != &local_118) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_128._1_7_,local_128[0]),local_118._M_allocated_capacity + 1)
      ;
    }
    if (local_108.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      (*(code *)(*local_108.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>.
                  _M_impl.super__Vector_impl_data._M_start)->sig_alg)();
    }
    if (local_140 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_140,local_140);
    }
  }
  else {
    CertFromPEM((anon_unknown_dwarf_b3fcdf *)&local_90,
                "\n-----BEGIN CERTIFICATE-----\nMIIBaDCCAQ2gAwIBAgIBAzAKBggqhkjOPQQDAjAoMSYwJAYDVQQDEx1OYW1lIENv\nbnN0cmFpbnRzIEludGVybWVkaWF0ZTAgFw0wMDAxMDEwMDAwMDBaGA8yMDk5MDEw\nMTAwMDAwMFowPjEeMBwGA1UEChMVQ29tbW9uIG5hbWUgcGVybWl0dGVkMRwwGgYD\nVQQDExNmb28ucGVybWl0dGVkMS50ZXN0MFkwEwYHKoZIzj0CAQYIKoZIzj0DAQcD\nQgAENX5Ycs8q8MRzPYUz6DqLHhJR3wcmniFRgkiEa7MxE/mRe00y0VGwH7xi7Aoc\nemXPrtD4JwN5bssbcxWGAKYYzaMQMA4wDAYDVR0TAQH/BAIwADAKBggqhkjOPQQD\nAgNJADBGAiEAtsnWuRQXtw2xbieC78Y8SVEtTjcZUx8uZyQe1GPLfGICIQDR4fNY\nyg3PC94ydPNQZVsFxAne32CbonWWsokalTFpUQ==\n-----END CERTIFICATE-----\n"
               );
    local_148[0] = local_90._M_head_impl != (X509 *)0x0;
    local_140 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (local_90._M_head_impl == (X509 *)0x0) {
      testing::Message::Message((Message *)&local_108);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_128,(internal *)local_148,(AssertionResult *)0x583db5,"false",
                 "true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_e8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                 ,0xcef,(char *)CONCAT71(local_128._1_7_,local_128[0]));
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_e8,(Message *)&local_108);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_128._1_7_,local_128[0]) != &local_118) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_128._1_7_,local_128[0]),
                        local_118._M_allocated_capacity + 1);
      }
      if (local_108.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        (*(code *)(*local_108.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>.
                    _M_impl.super__Vector_impl_data._M_start)->sig_alg)();
      }
      if (local_140 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_140,local_140);
      }
    }
    else {
      CertFromPEM((anon_unknown_dwarf_b3fcdf *)&local_a8,
                  "\n-----BEGIN CERTIFICATE-----\nMIIBazCCARCgAwIBAgIBBDAKBggqhkjOPQQDAjAoMSYwJAYDVQQDEx1OYW1lIENv\nbnN0cmFpbnRzIEludGVybWVkaWF0ZTAgFw0wMDAxMDEwMDAwMDBaGA8yMDk5MDEw\nMTAwMDAwMFowQTEiMCAGA1UEChMZQ29tbW9uIG5hbWUgbm90IHBlcm1pdHRlZDEb\nMBkGA1UEAxMSbm90LXBlcm1pdHRlZC50ZXN0MFkwEwYHKoZIzj0CAQYIKoZIzj0D\nAQcDQgAEzfghKuWf0JoXb0Drp09C3yXMSQQ1byt+AUaymvsHOWsxQ9v1Q+vkF/IM\nHRqGTk2TyxrB2iClVEn/Uu+YtYox1KMQMA4wDAYDVR0TAQH/BAIwADAKBggqhkjO\nPQQDAgNJADBGAiEAxaUslxmoWL1tIvnDz7gDkto/HcmdU0jHVuUQLXcCG8wCIQCN\n5xZjitlCQU8UB5qSu9wH4B+0JcVO3Ss4Az76HEJWMw==\n-----END CERTIFICATE-----\n"
                 );
      local_148[0] = (_Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>)
                     local_a8._M_t.super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_x509_st_*,_false>._M_head_impl != (x509_st *)0x0;
      local_140 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if ((_Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>)
          local_a8._M_t.super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_x509_st_*,_false>._M_head_impl == (x509_st *)0x0) {
        testing::Message::Message((Message *)&local_108);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_128,(internal *)local_148,(AssertionResult *)"not_permitted",
                   "false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_e8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                   ,0xcf2,(char *)CONCAT71(local_128._1_7_,local_128[0]));
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_e8,(Message *)&local_108);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_128._1_7_,local_128[0]) != &local_118) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT71(local_128._1_7_,local_128[0]),
                          local_118._M_allocated_capacity + 1);
        }
        if (local_108.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          (*(code *)(*local_108.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>.
                      _M_impl.super__Vector_impl_data._M_start)->sig_alg)();
        }
        if (local_140 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_140,local_140);
        }
      }
      else {
        CertFromPEM((anon_unknown_dwarf_b3fcdf *)&local_b0,
                    "\n-----BEGIN CERTIFICATE-----\nMIIBqTCCAU+gAwIBAgIBBjAKBggqhkjOPQQDAjAoMSYwJAYDVQQDEx1OYW1lIENv\nbnN0cmFpbnRzIEludGVybWVkaWF0ZTAgFw0wMDAxMDEwMDAwMDBaGA8yMDk5MDEw\nMTAwMDAwMFowSzEsMCoGA1UEChMjQ29tbW9uIG5hbWUgbm90IHBlcm1pdHRlZCB3\naXRoIFNBTlMxGzAZBgNVBAMTEm5vdC1wZXJtaXR0ZWQudGVzdDBZMBMGByqGSM49\nAgEGCCqGSM49AwEHA0IABKsn9wOApXFHrqhLdQgbFSeaSoAIbxgO0zVSRZUb5naR\n93zoL3MFOvZEF8xiEqh7le+l3XuUig0fwqpcsZzRNJajRTBDMAwGA1UdEwEB/wQC\nMAAwMwYDVR0RBCwwKoITZm9vLnBlcm1pdHRlZDEudGVzdIITZm9vLnBlcm1pdHRl\nZDIudGVzdDAKBggqhkjOPQQDAgNIADBFAiACk+1f184KkKAXuntmrz+Ygcq8MiZl\n4delx44FtcNaegIhAIA5nYfzxNcTXxDo3U+x1vSLH6Y7faLvHiFySp7O//q+\n-----END CERTIFICATE-----\n"
                   );
        local_148[0] = local_b0._M_head_impl != (X509 *)0x0;
        local_140 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (local_b0._M_head_impl == (X509 *)0x0) {
          testing::Message::Message((Message *)&local_108);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_128,(internal *)local_148,
                     (AssertionResult *)"not_permitted_with_sans","false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_e8,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                     ,0xcf5,(char *)CONCAT71(local_128._1_7_,local_128[0]));
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&local_e8,(Message *)&local_108);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_128._1_7_,local_128[0]) != &local_118) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT71(local_128._1_7_,local_128[0]),
                            local_118._M_allocated_capacity + 1);
          }
          if (local_108.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            (*(code *)(*local_108.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>.
                        _M_impl.super__Vector_impl_data._M_start)->sig_alg)();
          }
          if (local_140 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_140,local_140);
          }
        }
        else {
          CertFromPEM((anon_unknown_dwarf_b3fcdf *)&local_b8,
                      "\n-----BEGIN CERTIFICATE-----\nMIIBYTCCAQagAwIBAgIBCDAKBggqhkjOPQQDAjAoMSYwJAYDVQQDEx1OYW1lIENv\nbnN0cmFpbnRzIEludGVybWVkaWF0ZTAgFw0wMDAxMDEwMDAwMDBaGA8yMDk5MDEw\nMTAwMDAwMFowNzEcMBoGA1UEChMTQ29tbW9uIG5hbWUgbm90IEROUzEXMBUGA1UE\nAxMOTm90IGEgRE5TIG5hbWUwWTATBgcqhkjOPQIBBggqhkjOPQMBBwNCAASnueyc\nZxtnw5ke2J2T0/LwAK37auQP/RSFd9mem+BJVbgviawtAlignJmafp7Zw4/GdYEJ\nVm8qlriOJtluvXGcoxAwDjAMBgNVHRMBAf8EAjAAMAoGCCqGSM49BAMCA0kAMEYC\nIQChUAmVNI39VHe0zemRE09VDcSEgOxr1nTvjLcg/Q8pVQIhAJYZnJI0YZAi05QH\nRHNlAkTK2TnUaVn3fGSylaLiFS1r\n-----END CERTIFICATE-----\n"
                     );
          local_148[0] = local_b8._M_head_impl != (X509 *)0x0;
          local_140 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if (local_b8._M_head_impl == (X509 *)0x0) {
            this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_140;
            testing::Message::Message((Message *)&local_108);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_128,(internal *)local_148,(AssertionResult *)"not_dns",
                       "false","true",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_e8,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                       ,0xcf7,(char *)CONCAT71(local_128._1_7_,local_128[0]));
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_e8,(Message *)&local_108);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT71(local_128._1_7_,local_128[0]) != &local_118) {
              operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)CONCAT71(local_128._1_7_,local_128[0]),
                              local_118._M_allocated_capacity + 1);
            }
            if (local_108.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              (*(code *)(*local_108.
                          super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
                          super__Vector_impl_data._M_start)->sig_alg)();
            }
            local_120 = local_140;
            if (local_140 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
            goto LAB_003b892a;
          }
          else {
            local_148._0_4_ = 0x43;
            local_e8.root = (UniquePtr<X509> *)&local_a0;
            local_e8.intermediate = (UniquePtr<X509> *)&local_c0;
            iVar3 = TestBody::anon_class_16_2_a4d0f9f0::operator()
                              (&local_e8,local_90._M_head_impl,0x576f70,in_RCX);
            local_108.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
            super__Vector_impl_data._M_start =
                 (pointer)CONCAT44(local_108.
                                   super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start._4_4_,iVar3);
            testing::internal::CmpHelperEQ<int,int>
                      ((internal *)local_128,"67",
                       "verify_cert(permitted.get(), 0 , kCommonNamePermitted)",(int *)local_148,
                       (int *)&local_108);
            if (local_128[0] == (internal)0x0) {
              testing::Message::Message((Message *)local_148);
              if (local_120 ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                message = "";
              }
              else {
                message = (local_120->_M_dataplus)._M_p;
              }
              pcVar4 = (char *)0xd08;
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_108,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                         ,0xd08,message);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_108,(Message *)local_148);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_108);
              if ((long *)CONCAT44(local_148._4_4_,local_148._0_4_) != (long *)0x0) {
                (**(code **)(*(long *)CONCAT44(local_148._4_4_,local_148._0_4_) + 8))();
              }
            }
            if (local_120 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_120,local_120);
            }
            local_148._0_4_ = 0x43;
            iVar3 = TestBody::anon_class_16_2_a4d0f9f0::operator()
                              (&local_e8,
                               (X509 *)local_a8._M_t.
                                       super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                                       super__Head_base<0UL,_x509_st_*,_false>._M_head_impl,0x576f90
                               ,pcVar4);
            local_108.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
            super__Vector_impl_data._M_start =
                 (pointer)CONCAT44(local_108.
                                   super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start._4_4_,iVar3);
            testing::internal::CmpHelperEQ<int,int>
                      ((internal *)local_128,"67",
                       "verify_cert(not_permitted.get(), 0 , kCommonNameNotPermitted)",
                       (int *)local_148,(int *)&local_108);
            if (local_128[0] == (internal)0x0) {
              testing::Message::Message((Message *)local_148);
              if (local_120 ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar4 = "";
              }
              else {
                pcVar4 = (local_120->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_108,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                         ,0xd0b,pcVar4);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_108,(Message *)local_148);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_108);
              if ((long *)CONCAT44(local_148._4_4_,local_148._0_4_) != (long *)0x0) {
                (**(code **)(*(long *)CONCAT44(local_148._4_4_,local_148._0_4_) + 8))();
              }
            }
            if (local_120 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_120,local_120);
            }
            local_d4 = 0x43;
            local_80._M_head_impl = local_a0._M_head_impl;
            __l._M_len = 1;
            __l._M_array = &local_80._M_head_impl;
            std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                      ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_128,__l,&local_129);
            local_88._M_head_impl = local_c0._M_head_impl;
            __l_00._M_len = 1;
            __l_00._M_array = &local_88._M_head_impl;
            std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                      ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_148,__l_00,&local_12a)
            ;
            local_108.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            local_108.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            local_108.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_38._M_unused._M_object = (void *)0x0;
            local_38._8_8_ = 0;
            local_28 = (code *)0x0;
            uStack_20 = 0;
            local_94 = Verify((X509 *)local_a8._M_t.
                                      super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                                      super__Head_base<0UL,_x509_st_*,_false>._M_head_impl,
                              (vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_128,
                              (vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_148,&local_108,
                              0,(function<void_(x509_store_ctx_st_*)> *)&local_38);
            testing::internal::CmpHelperEQ<int,int>
                      (local_d0,"67",
                       "Verify(not_permitted.get(), {root.get()}, {intermediate.get()}, {}, 0 , nullptr)"
                       ,&local_d4,&local_94);
            if (local_28 != (code *)0x0) {
              (*local_28)(&local_38,&local_38,__destroy_functor);
            }
            pvVar1 = (void *)CONCAT44(local_148._4_4_,local_148._0_4_);
            if (pvVar1 != (void *)0x0) {
              operator_delete(pvVar1,(long)local_138 - (long)pvVar1);
            }
            pvVar1 = (void *)CONCAT71(local_128._1_7_,local_128[0]);
            if (pvVar1 != (void *)0x0) {
              operator_delete(pvVar1,local_118._M_allocated_capacity - (long)pvVar1);
            }
            if (local_d0[0] == (internal)0x0) {
              testing::Message::Message((Message *)local_128);
              if (local_c8 ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar4 = "";
              }
              else {
                pcVar4 = (local_c8->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)local_148,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                         ,0xd11,pcVar4);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)local_148,(Message *)local_128);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_148);
              if ((long *)CONCAT71(local_128._1_7_,local_128[0]) != (long *)0x0) {
                (**(code **)(*(long *)CONCAT71(local_128._1_7_,local_128[0]) + 8))();
              }
            }
            if (local_c8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_c8,local_c8);
            }
            _Var2._M_head_impl = local_b0._M_head_impl;
            local_d4 = 0;
            local_80._M_head_impl = local_a0._M_head_impl;
            __l_01._M_len = 1;
            __l_01._M_array = &local_80._M_head_impl;
            std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                      ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_128,__l_01,&local_129)
            ;
            local_88._M_head_impl = local_c0._M_head_impl;
            __l_02._M_len = 1;
            __l_02._M_array = &local_88._M_head_impl;
            std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                      ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_148,__l_02,&local_12a)
            ;
            local_108.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            local_108.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            local_108.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_58._M_unused._M_object = (void *)0x0;
            local_58._8_8_ = 0;
            local_48 = (code *)0x0;
            uStack_40 = 0;
            local_94 = Verify(_Var2._M_head_impl,
                              (vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_128,
                              (vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_148,&local_108,
                              0,(function<void_(x509_store_ctx_st_*)> *)&local_58);
            piVar5 = &local_d4;
            testing::internal::CmpHelperEQ<int,int>
                      (local_d0,"0",
                       "Verify(not_permitted_with_sans.get(), {root.get()}, {intermediate.get()}, {}, 0, nullptr)"
                       ,piVar5,&local_94);
            if (local_48 != (code *)0x0) {
              (*local_48)(&local_58,&local_58,__destroy_functor);
            }
            pvVar1 = (void *)CONCAT44(local_148._4_4_,local_148._0_4_);
            if (pvVar1 != (void *)0x0) {
              operator_delete(pvVar1,(long)local_138 - (long)pvVar1);
            }
            pvVar1 = (void *)CONCAT71(local_128._1_7_,local_128[0]);
            if (pvVar1 != (void *)0x0) {
              operator_delete(pvVar1,local_118._M_allocated_capacity - (long)pvVar1);
            }
            if (local_d0[0] == (internal)0x0) {
              testing::Message::Message((Message *)local_128);
              if (local_c8 ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar4 = "";
              }
              else {
                pcVar4 = (local_c8->_M_dataplus)._M_p;
              }
              piVar5 = (int *)0xd16;
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)local_148,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                         ,0xd16,pcVar4);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)local_148,(Message *)local_128);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_148);
              if ((long *)CONCAT71(local_128._1_7_,local_128[0]) != (long *)0x0) {
                (**(code **)(*(long *)CONCAT71(local_128._1_7_,local_128[0]) + 8))();
              }
            }
            if (local_c8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_c8,local_c8);
            }
            local_148._0_4_ = 0x3e;
            iVar3 = TestBody::anon_class_16_2_a4d0f9f0::operator()
                              (&local_e8,local_b0._M_head_impl,0x576fb0,(char *)piVar5);
            local_108.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
            super__Vector_impl_data._M_start =
                 (pointer)CONCAT44(local_108.
                                   super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start._4_4_,iVar3);
            testing::internal::CmpHelperEQ<int,int>
                      ((internal *)local_128,"62",
                       "verify_cert(not_permitted_with_sans.get(), 0 , kCommonNameNotPermittedWithSANs)"
                       ,(int *)local_148,(int *)&local_108);
            if (local_128[0] == (internal)0x0) {
              testing::Message::Message((Message *)local_148);
              if (local_120 ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar4 = "";
              }
              else {
                pcVar4 = (local_120->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_108,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                         ,0xd19,pcVar4);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_108,(Message *)local_148);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_108);
              if ((long *)CONCAT44(local_148._4_4_,local_148._0_4_) != (long *)0x0) {
                (**(code **)(*(long *)CONCAT44(local_148._4_4_,local_148._0_4_) + 8))();
              }
            }
            if (local_120 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_120,local_120);
            }
            _Var2._M_head_impl = local_b8._M_head_impl;
            local_d4 = 0;
            local_80._M_head_impl = local_a0._M_head_impl;
            __l_03._M_len = 1;
            __l_03._M_array = &local_80._M_head_impl;
            std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                      ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_128,__l_03,&local_129)
            ;
            local_88._M_head_impl = local_c0._M_head_impl;
            __l_04._M_len = 1;
            __l_04._M_array = &local_88._M_head_impl;
            std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                      ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_148,__l_04,&local_12a)
            ;
            local_108.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            local_108.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            local_108.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_78._M_unused._M_object = (void *)0x0;
            local_78._8_8_ = 0;
            local_68 = (code *)0x0;
            uStack_60 = 0;
            local_94 = Verify(_Var2._M_head_impl,
                              (vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_128,
                              (vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_148,&local_108,
                              0,(function<void_(x509_store_ctx_st_*)> *)&local_78);
            piVar5 = &local_d4;
            testing::internal::CmpHelperEQ<int,int>
                      (local_d0,"0",
                       "Verify(not_dns.get(), {root.get()}, {intermediate.get()}, {}, 0, nullptr)",
                       piVar5,&local_94);
            if (local_68 != (code *)0x0) {
              (*local_68)(&local_78,&local_78,__destroy_functor);
            }
            pvVar1 = (void *)CONCAT44(local_148._4_4_,local_148._0_4_);
            if (pvVar1 != (void *)0x0) {
              operator_delete(pvVar1,(long)local_138 - (long)pvVar1);
            }
            pvVar1 = (void *)CONCAT71(local_128._1_7_,local_128[0]);
            if (pvVar1 != (void *)0x0) {
              operator_delete(pvVar1,local_118._M_allocated_capacity - (long)pvVar1);
            }
            if (local_d0[0] == (internal)0x0) {
              testing::Message::Message((Message *)local_128);
              if (local_c8 ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar4 = "";
              }
              else {
                pcVar4 = (local_c8->_M_dataplus)._M_p;
              }
              piVar5 = (int *)0xd1e;
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)local_148,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                         ,0xd1e,pcVar4);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)local_148,(Message *)local_128);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_148);
              if ((long *)CONCAT71(local_128._1_7_,local_128[0]) != (long *)0x0) {
                (**(code **)(*(long *)CONCAT71(local_128._1_7_,local_128[0]) + 8))();
              }
            }
            if (local_c8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_c8,local_c8);
            }
            local_148._0_4_ = 0x3e;
            iVar3 = TestBody::anon_class_16_2_a4d0f9f0::operator()
                              (&local_e8,local_b8._M_head_impl,0x576fc3,(char *)piVar5);
            local_108.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
            super__Vector_impl_data._M_start =
                 (pointer)CONCAT44(local_108.
                                   super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start._4_4_,iVar3);
            testing::internal::CmpHelperEQ<int,int>
                      ((internal *)local_128,"62",
                       "verify_cert(not_dns.get(), 0 , kCommonNameNotDNS)",(int *)local_148,
                       (int *)&local_108);
            if (local_128[0] == (internal)0x0) {
              testing::Message::Message((Message *)local_148);
              if (local_120 ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                message_00 = "";
              }
              else {
                message_00 = (local_120->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_108,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                         ,0xd20,message_00);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_108,(Message *)local_148);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_108);
              if ((long *)CONCAT44(local_148._4_4_,local_148._0_4_) != (long *)0x0) {
                (**(code **)(*(long *)CONCAT44(local_148._4_4_,local_148._0_4_) + 8))();
              }
            }
            if (local_120 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&local_120;
LAB_003b892a:
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()(this_00,local_120);
            }
          }
          std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
                    ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&local_b8);
        }
        std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
                  ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&local_b0);
      }
      std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&local_a8);
    }
    std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&local_90);
  }
  std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&local_c0);
LAB_003b8970:
  std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&local_a0);
  return;
}

Assistant:

TEST(X509Test, CommonNameAndNameConstraints) {
  bssl::UniquePtr<X509> root = CertFromPEM(kSANTypesRoot);
  ASSERT_TRUE(root);
  bssl::UniquePtr<X509> intermediate = CertFromPEM(kConstrainedIntermediate);
  ASSERT_TRUE(intermediate);
  bssl::UniquePtr<X509> permitted = CertFromPEM(kCommonNamePermittedLeaf);
  ASSERT_TRUE(permitted);
  bssl::UniquePtr<X509> not_permitted =
      CertFromPEM(kCommonNameNotPermittedLeaf);
  ASSERT_TRUE(not_permitted);
  bssl::UniquePtr<X509> not_permitted_with_sans =
      CertFromPEM(kCommonNameNotPermittedWithSANsLeaf);
  ASSERT_TRUE(not_permitted_with_sans);
  bssl::UniquePtr<X509> not_dns = CertFromPEM(kCommonNameNotDNSLeaf);
  ASSERT_TRUE(not_dns);

  auto verify_cert = [&](X509 *leaf, unsigned flags, const char *host) {
    return Verify(
        leaf, {root.get()}, {intermediate.get()}, {}, 0,
        [&](X509_STORE_CTX *ctx) {
          X509_VERIFY_PARAM *param = X509_STORE_CTX_get0_param(ctx);
          ASSERT_TRUE(X509_VERIFY_PARAM_set1_host(param, host, strlen(host)));
          X509_VERIFY_PARAM_set_hostflags(param, flags);
        });
  };

  // Certificates which would otherwise trigger the common name fallback are
  // rejected whenever there are name constraints. We do this whether or not
  // the common name matches the constraints.
  EXPECT_EQ(
      X509_V_ERR_NAME_CONSTRAINTS_WITHOUT_SANS,
      verify_cert(permitted.get(), 0 /* no flags */, kCommonNamePermitted));
  EXPECT_EQ(X509_V_ERR_NAME_CONSTRAINTS_WITHOUT_SANS,
            verify_cert(not_permitted.get(), 0 /* no flags */,
                        kCommonNameNotPermitted));

  // This occurs even if the built-in name checks aren't used. The caller may
  // separately call |X509_check_host|.
  EXPECT_EQ(X509_V_ERR_NAME_CONSTRAINTS_WITHOUT_SANS,
            Verify(not_permitted.get(), {root.get()}, {intermediate.get()}, {},
                   0 /* no flags */, nullptr));

  // If the leaf certificate has SANs, the common name fallback is always
  // disabled, so the name constraints do not apply.
  EXPECT_EQ(X509_V_OK, Verify(not_permitted_with_sans.get(), {root.get()},
                              {intermediate.get()}, {}, 0, nullptr));
  EXPECT_EQ(X509_V_ERR_HOSTNAME_MISMATCH,
            verify_cert(not_permitted_with_sans.get(), 0 /* no flags */,
                        kCommonNameNotPermittedWithSANs));

  // If the common name does not look like a DNS name, we apply neither name
  // constraints nor common name fallback.
  EXPECT_EQ(X509_V_OK, Verify(not_dns.get(), {root.get()}, {intermediate.get()},
                              {}, 0, nullptr));
  EXPECT_EQ(X509_V_ERR_HOSTNAME_MISMATCH,
            verify_cert(not_dns.get(), 0 /* no flags */, kCommonNameNotDNS));
}